

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 * rw::ps2::instanceXYZ(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  Object *pOVar3;
  uint local_3c;
  uint32 i;
  uint32 *d;
  uint16 j;
  uint32 n_local;
  uint32 idx_local;
  Mesh *m_local;
  Geometry *g_local;
  uint32 *p_local;
  
  pVVar2 = g->morphTargets->vertices;
  g_local = (Geometry *)p;
  for (local_3c = idx; local_3c < idx + n; local_3c = local_3c + 1) {
    uVar1 = m->indices[local_3c];
    *(float32 *)&g_local->object = (&pVVar2->x)[(int)((uint)uVar1 * 3)];
    pOVar3 = &g_local->object;
    *(float32 *)&(g_local->object).field_0x4 = (&pVVar2->x)[(int)((uint)uVar1 * 3 + 1)];
    g_local = (Geometry *)((long)&(g_local->object).parent + 4);
    *(float32 *)&pOVar3->parent = (&pVVar2->x)[(int)((uint)uVar1 * 3 + 2)];
  }
  for (; ((ulong)g_local & 0xf) != 0; g_local = (Geometry *)&(g_local->object).field_0x4) {
    (g_local->object).type = '\0';
    (g_local->object).subType = '\0';
    (g_local->object).flags = '\0';
    (g_local->object).privateFlags = '\0';
  }
  return (uint32 *)g_local;
}

Assistant:

uint32*
instanceXYZ(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->morphTargets[0].vertices;
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		*p++ = d[j*3+0];
		*p++ = d[j*3+1];
		*p++ = d[j*3+2];
	}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}